

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O0

type __thiscall
nonstd::expected_lite::expected<void,_char>::swap<char>
          (expected<void,_char> *this,expected<void,_char> *other)

{
  bool bVar1;
  bool v;
  error_type_conflict *peVar2;
  error_type_conflict *__b;
  bool other_has_value;
  bool has_value;
  expected<void,_char> *other_local;
  expected<void,_char> *this_local;
  
  bVar1 = expected_lite::expected::operator_cast_to_bool((expected *)this);
  if ((bVar1) || (bVar1 = expected_lite::expected::operator_cast_to_bool((expected *)other), bVar1))
  {
    bVar1 = expected_lite::expected::operator_cast_to_bool((expected *)this);
    if ((!bVar1) ||
       (bVar1 = expected_lite::expected::operator_cast_to_bool((expected *)other), bVar1)) {
      bVar1 = expected_lite::expected::operator_cast_to_bool((expected *)this);
      if ((!bVar1) &&
         (bVar1 = expected_lite::expected::operator_cast_to_bool((expected *)other), bVar1)) {
        swap<char>(other,this);
      }
    }
    else {
      peVar2 = error(other);
      detail::storage_t_impl<void,_char>::construct_error((storage_t_impl<void,_char> *)this,peVar2)
      ;
      bVar1 = detail::storage_t_impl<void,_char>::has_value((storage_t_impl<void,_char> *)this);
      v = expected<void,_char>::has_value(other);
      detail::storage_t_impl<void,_char>::set_has_value((storage_t_impl<void,_char> *)other,bVar1);
      detail::storage_t_impl<void,_char>::set_has_value((storage_t_impl<void,_char> *)this,v);
    }
  }
  else {
    peVar2 = detail::storage_t_impl<void,_char>::error((storage_t_impl<void,_char> *)this);
    __b = detail::storage_t_impl<void,_char>::error((storage_t_impl<void,_char> *)other);
    std::swap<char>(peVar2,__b);
  }
  return;
}

Assistant:

swap( expected & other ) noexcept
    (
        std::is_nothrow_move_constructible<E>::value && std17::is_nothrow_swappable<E&>::value
    )
    {
        using std::swap;

        if      ( ! bool(*this) && ! bool(other) ) { swap( contained.error(), other.contained.error() ); }
        else if (   bool(*this) && ! bool(other) ) { contained.construct_error( std::move( other.error() ) );
                                                     bool has_value = contained.has_value();
                                                     bool other_has_value = other.has_value();
                                                     other.contained.set_has_value(has_value);
                                                     contained.set_has_value(other_has_value);
                                                     }
        else if ( ! bool(*this) &&   bool(other) ) { other.swap( *this ); }
    }